

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunction.h
# Opt level: O3

void __thiscall
Js::FunctionWithHomeObj<Js::GeneratorVirtualScriptFunction>::MarshalToScriptContext
          (FunctionWithHomeObj<Js::GeneratorVirtualScriptFunction> *this,
          ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if ((((((this->super_GeneratorVirtualScriptFunction).super_ScriptFunction.super_ScriptFunctionBase
          .super_JavascriptFunction.super_DynamicObject.super_RecyclableObject.type.ptr)->
        javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr == scriptContext) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/ScriptFunction.h"
                                ,0x36,"(this->GetScriptContext() != scriptContext)",
                                "this->GetScriptContext() != scriptContext");
    if (!bVar2) goto LAB_00ccb63c;
    *puVar3 = 0;
  }
  if (*(long *)&(this->super_GeneratorVirtualScriptFunction).super_ScriptFunction.
                super_ScriptFunctionBase.super_JavascriptFunction.super_DynamicObject.
                super_RecyclableObject.super_FinalizableObject !=
      VirtualTableInfo<Js::FunctionWithHomeObj<Js::GeneratorVirtualScriptFunction>_>::Address) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/ScriptFunction.h"
                                ,0x36,
                                "(VirtualTableInfo<FunctionWithHomeObj<BaseClass>>::HasVirtualTable(this))"
                                ,"Derived class need to define marshal to script context");
    if (!bVar2) {
LAB_00ccb63c:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  (this->super_GeneratorVirtualScriptFunction).super_ScriptFunction.super_ScriptFunctionBase.
  super_JavascriptFunction.super_DynamicObject.super_RecyclableObject.super_FinalizableObject =
       (FinalizableObject)
       VirtualTableInfo<Js::CrossSiteObject<Js::FunctionWithHomeObj<Js::GeneratorVirtualScriptFunction>_>_>
       ::Address;
  return;
}

Assistant:

FunctionWithHomeObj(FunctionProxy* proxy, ScriptFunctionType* deferredPrototypeType)
            : BaseClass(proxy, deferredPrototypeType), homeObj(nullptr)
        {
            Assert(proxy->GetFunctionInfo()->HasHomeObj());
        }